

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

VectorXd __thiscall util::argmax(util *this,MatrixXd *m,int axis)

{
  long lVar1;
  Scalar *pSVar2;
  Index extraout_RDX;
  Index IVar3;
  Index extraout_RDX_00;
  int i;
  ulong i_00;
  VectorXd VVar4;
  Index ind;
  size_t _len;
  long local_78;
  ulong local_70;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_68 [56];
  
  local_70 = (&(m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows)[axis != 0];
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_70);
  local_78 = -1;
  IVar3 = extraout_RDX;
  for (i_00 = 0; i_00 < local_70; i_00 = i_00 + 1) {
    if (axis == 0) {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,m,
                 i_00);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::maxCoeff<long>((DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                        *)local_68,&local_78);
    }
    else {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_68,m,
                 i_00);
      Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      maxCoeff<long>(local_68,&local_78);
    }
    lVar1 = local_78;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_00);
    *pSVar2 = (double)lVar1;
    IVar3 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd argmax(const Eigen::MatrixXd& m, int axis) {
		using namespace Eigen;

		const bool _rowwise = (axis == 0);

		size_t _len = _rowwise ? m.rows() : m.cols();
		VectorXd _indices(_len);

		Index ind = -1;
		for (int i = 0; i < _len; i++) {
			if (_rowwise)
				m.row(i).maxCoeff(&ind);
			else
				m.col(i).maxCoeff(&ind);
			_indices[i] = static_cast<double>(ind);
		}

		return _indices;
	}